

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O0

int lib::base::DoPairs(State *state)

{
  bool bVar1;
  Value *pVVar2;
  State *in_RDI;
  Value *unaff_retaddr;
  Value value;
  Value key;
  Value *last_key;
  Table *t;
  StackAPI api;
  Value *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Value *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Table *in_stack_ffffffffffffffc8;
  StackAPI local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>
                    ((StackAPI *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                     in_stack_ffffffffffffffb0);
  if (bVar1) {
    luna::StackAPI::GetTable((StackAPI *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    pVVar2 = luna::StackAPI::GetValue
                       ((StackAPI *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    luna::Value::Value((Value *)&stack0xffffffffffffffc0);
    luna::Value::Value((Value *)&stack0xffffffffffffffb0);
    if (pVVar2->type_ == ValueT_Nil) {
      luna::Table::FirstKeyValue
                (in_stack_ffffffffffffffc8,
                 (Value *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
    else {
      luna::Table::NextKeyValue
                (value.field_0.table_,unaff_retaddr,
                 (Value *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (Value *)in_RDI);
    }
    luna::StackAPI::PushValue
              ((StackAPI *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    luna::StackAPI::PushValue
              ((StackAPI *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    iVar3 = 2;
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int DoPairs(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_Table))
            return 0;

        luna::Table *t = api.GetTable(0);
        luna::Value *last_key = api.GetValue(1);

        luna::Value key;
        luna::Value value;
        if (last_key->type_ == luna::ValueT_Nil)
            t->FirstKeyValue(key, value);
        else
            t->NextKeyValue(*last_key, key, value);

        api.PushValue(key);
        api.PushValue(value);
        return 2;
    }